

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.C
# Opt level: O3

bool __thiscall Filter::matchContent(Filter *this,string *line,Match *pmatch)

{
  bool bVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (this->m_inContent).
           super__List_base<std::unique_ptr<Regex,_std::default_delete<Regex>_>,_std::allocator<std::unique_ptr<Regex,_std::default_delete<Regex>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 == (_List_node_base *)&this->m_inContent) {
    bVar1 = true;
  }
  else {
    do {
      bVar1 = Regex::match((Regex *)p_Var2[1]._M_next,line,pmatch);
      if (bVar1) {
        return bVar1;
      }
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)&this->m_inContent);
  }
  return bVar1;
}

Assistant:

bool Filter::matchContent(std::string const & line, Match * pmatch) const
{
    bool match = m_inContent.empty();

    // Include filters
    Regex::PtrList::const_iterator it = m_inContent.begin();
    for (; !match && it != m_inContent.end(); ++it) {
        match = (*it)->match(line, pmatch);
    }
    return match;
}